

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

int Aig_ObjIsMuxType(Aig_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  bool local_55;
  bool local_31;
  Aig_Obj_t *pNode1;
  Aig_Obj_t *pNode0;
  Aig_Obj_t *pNode_local;
  
  iVar1 = Aig_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigUtil.c"
                  ,0x137,"int Aig_ObjIsMuxType(Aig_Obj_t *)");
  }
  iVar1 = Aig_ObjIsAnd(pNode);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = Aig_ObjFaninC0(pNode);
  if ((iVar1 == 0) || (iVar1 = Aig_ObjFaninC1(pNode), iVar1 == 0)) {
    return 0;
  }
  pObj = Aig_ObjFanin0(pNode);
  pObj_00 = Aig_ObjFanin1(pNode);
  iVar1 = Aig_ObjIsAnd(pObj);
  if ((iVar1 == 0) || (iVar1 = Aig_ObjIsAnd(pObj_00), iVar1 == 0)) {
    return 0;
  }
  pAVar3 = Aig_ObjFanin0(pObj);
  pAVar4 = Aig_ObjFanin0(pObj_00);
  if (pAVar3 == pAVar4) {
    iVar1 = Aig_ObjFaninC0(pObj);
    iVar2 = Aig_ObjFaninC0(pObj_00);
    local_31 = true;
    if (iVar1 != iVar2) goto LAB_0085253b;
  }
  pAVar3 = Aig_ObjFanin0(pObj);
  pAVar4 = Aig_ObjFanin1(pObj_00);
  if (pAVar3 == pAVar4) {
    iVar1 = Aig_ObjFaninC0(pObj);
    iVar2 = Aig_ObjFaninC1(pObj_00);
    local_31 = true;
    if (iVar1 != iVar2) goto LAB_0085253b;
  }
  pAVar3 = Aig_ObjFanin1(pObj);
  pAVar4 = Aig_ObjFanin0(pObj_00);
  if (pAVar3 == pAVar4) {
    iVar1 = Aig_ObjFaninC1(pObj);
    iVar2 = Aig_ObjFaninC0(pObj_00);
    local_31 = true;
    if (iVar1 != iVar2) goto LAB_0085253b;
  }
  pAVar3 = Aig_ObjFanin1(pObj);
  pAVar4 = Aig_ObjFanin1(pObj_00);
  local_55 = false;
  if (pAVar3 == pAVar4) {
    iVar1 = Aig_ObjFaninC1(pObj);
    iVar2 = Aig_ObjFaninC1(pObj_00);
    local_55 = iVar1 != iVar2;
  }
  local_31 = local_55;
LAB_0085253b:
  return (uint)local_31;
}

Assistant:

int Aig_ObjIsMuxType( Aig_Obj_t * pNode )
{
    Aig_Obj_t * pNode0, * pNode1;
    // check that the node is regular
    assert( !Aig_IsComplement(pNode) );
    // if the node is not AND, this is not MUX
    if ( !Aig_ObjIsAnd(pNode) )
        return 0;
    // if the children are not complemented, this is not MUX
    if ( !Aig_ObjFaninC0(pNode) || !Aig_ObjFaninC1(pNode) )
        return 0;
    // get children
    pNode0 = Aig_ObjFanin0(pNode);
    pNode1 = Aig_ObjFanin1(pNode);
    // if the children are not ANDs, this is not MUX
    if ( !Aig_ObjIsAnd(pNode0) || !Aig_ObjIsAnd(pNode1) )
        return 0;
    // otherwise the node is MUX iff it has a pair of equal grandchildren
    return (Aig_ObjFanin0(pNode0) == Aig_ObjFanin0(pNode1) && (Aig_ObjFaninC0(pNode0) ^ Aig_ObjFaninC0(pNode1))) || 
           (Aig_ObjFanin0(pNode0) == Aig_ObjFanin1(pNode1) && (Aig_ObjFaninC0(pNode0) ^ Aig_ObjFaninC1(pNode1))) ||
           (Aig_ObjFanin1(pNode0) == Aig_ObjFanin0(pNode1) && (Aig_ObjFaninC1(pNode0) ^ Aig_ObjFaninC0(pNode1))) ||
           (Aig_ObjFanin1(pNode0) == Aig_ObjFanin1(pNode1) && (Aig_ObjFaninC1(pNode0) ^ Aig_ObjFaninC1(pNode1)));
}